

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_rom_writer.cpp
# Opt level: O0

void write_map_connections(World *world,ROM *rom)

{
  initializer_list<unsigned_char> __l;
  pointer this;
  bool bVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  uint32_t longWord;
  vector<MapConnection,_std::allocator<MapConnection>_> *this_00;
  allocator<char> local_c1;
  string local_c0;
  uint32_t local_a0;
  allocator<unsigned_char> local_99;
  uint32_t new_map_connections_table_addr;
  byte local_94;
  undefined1 local_93;
  uint8_t local_92;
  uint8_t local_91;
  uint32_t *local_90;
  size_type local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  uint8_t local_68;
  uint8_t local_67;
  undefined1 local_66;
  byte local_65;
  uint8_t local_64;
  uint8_t local_63;
  undefined1 local_62;
  byte local_61;
  uint8_t byte_8;
  uint8_t byte_7;
  uint8_t byte_6;
  uint8_t byte_5;
  uint8_t byte_4;
  uint8_t byte_3;
  uint8_t byte_2;
  uint8_t byte_1;
  MapConnection *connection;
  const_iterator __end1;
  const_iterator __begin1;
  vector<MapConnection,_std::allocator<MapConnection>_> *__range1;
  ByteArray map_connection_bytes;
  ROM *rom_local;
  World *world_local;
  
  map_connection_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = &rom->_was_open;
  ByteArray::ByteArray((ByteArray *)&__range1);
  this_00 = World::map_connections(world);
  __end1 = std::vector<MapConnection,_std::allocator<MapConnection>_>::begin(this_00);
  connection = (MapConnection *)
               std::vector<MapConnection,_std::allocator<MapConnection>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_MapConnection_*,_std::vector<MapConnection,_std::allocator<MapConnection>_>_>
                      (&__end1,(__normal_iterator<const_MapConnection_*,_std::vector<MapConnection,_std::allocator<MapConnection>_>_>
                                *)&connection);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    _byte_8 = __gnu_cxx::
              __normal_iterator<const_MapConnection_*,_std::vector<MapConnection,_std::allocator<MapConnection>_>_>
              ::operator*(&__end1);
    uVar3 = MapConnection::map_id_1(_byte_8);
    local_61 = (byte)(uVar3 >> 8) & 3;
    uVar2 = MapConnection::extra_byte_1(_byte_8);
    local_61 = local_61 | uVar2 << 2;
    uVar3 = MapConnection::map_id_1(_byte_8);
    local_62 = (undefined1)uVar3;
    local_63 = MapConnection::pos_x_1(_byte_8);
    local_64 = MapConnection::pos_y_1(_byte_8);
    uVar3 = MapConnection::map_id_2(_byte_8);
    local_65 = (byte)(uVar3 >> 8) & 3;
    uVar2 = MapConnection::extra_byte_2(_byte_8);
    local_65 = local_65 | uVar2 << 2;
    uVar3 = MapConnection::map_id_2(_byte_8);
    local_66 = (undefined1)uVar3;
    local_67 = MapConnection::pos_x_2(_byte_8);
    local_91 = MapConnection::pos_y_2(_byte_8);
    new_map_connections_table_addr._0_1_ = local_61;
    new_map_connections_table_addr._1_1_ = local_62;
    new_map_connections_table_addr._2_1_ = local_63;
    new_map_connections_table_addr._3_1_ = local_64;
    local_94 = local_65;
    local_93 = local_66;
    local_92 = local_67;
    local_90 = &new_map_connections_table_addr;
    local_88 = 8;
    local_68 = local_91;
    std::allocator<unsigned_char>::allocator(&local_99);
    __l._M_len = local_88;
    __l._M_array = (iterator)local_90;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_80,__l,&local_99);
    ByteArray::add_bytes((ByteArray *)&__range1,&local_80);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_80);
    std::allocator<unsigned_char>::~allocator(&local_99);
    __gnu_cxx::
    __normal_iterator<const_MapConnection_*,_std::vector<MapConnection,_std::allocator<MapConnection>_>_>
    ::operator++(&__end1);
  }
  ByteArray::add_word((ByteArray *)&__range1,0xffff);
  md::ROM::mark_empty_chunk
            ((ROM *)map_connection_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                    .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,0x11cea2,0x11ea64);
  this = map_connection_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c1);
  longWord = md::ROM::inject_bytes
                       ((ROM *)this,
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1,&local_c0
                       );
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  local_a0 = longWord;
  md::ROM::set_long((ROM *)map_connection_bytes.
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,0xa0a08,longWord);
  ByteArray::~ByteArray((ByteArray *)&__range1);
  return;
}

Assistant:

static void write_map_connections(const World& world, md::ROM& rom)
{
    ByteArray map_connection_bytes;

    for(const MapConnection& connection : world.map_connections())
    {
        uint8_t byte_1 = (connection.map_id_1() >> 8) & 0x03;
        byte_1 |= (connection.extra_byte_1() << 2) & 0xFC;
        uint8_t byte_2 = connection.map_id_1() & 0xFF;
        uint8_t byte_3 = connection.pos_x_1();
        uint8_t byte_4 = connection.pos_y_1();

        uint8_t byte_5 = (connection.map_id_2() >> 8) & 0x03;
        byte_5 |= (connection.extra_byte_2() << 2) & 0xFC;
        uint8_t byte_6 = connection.map_id_2() & 0xFF;
        uint8_t byte_7 = connection.pos_x_2();
        uint8_t byte_8 = connection.pos_y_2();

        map_connection_bytes.add_bytes({ byte_1, byte_2, byte_3, byte_4, byte_5, byte_6, byte_7, byte_8 });
    }

    map_connection_bytes.add_word(0xFFFF);

    rom.mark_empty_chunk(offsets::MAP_CONNECTIONS_TABLE, offsets::MAP_CONNECTIONS_TABLE_END);
    uint32_t new_map_connections_table_addr = rom.inject_bytes(map_connection_bytes);
    rom.set_long(offsets::MAP_CONNECTIONS_TABLE_POINTER, new_map_connections_table_addr);
}